

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::InitPageDesc(PF_BufferMgr *this,int fd,PageNum pageNum,int slot)

{
  PF_BufPageDesc *pPVar1;
  
  pPVar1 = this->bufTable;
  pPVar1[slot].fd = fd;
  pPVar1[slot].pageNum = pageNum;
  pPVar1[slot].bDirty = 0;
  pPVar1[slot].pinCount = 1;
  return 0;
}

Assistant:

RC PF_BufferMgr::InitPageDesc(int fd, PageNum pageNum, int slot)
{
   // set the slot to refer to a newly-pinned page
   bufTable[slot].fd       = fd;
   bufTable[slot].pageNum  = pageNum;
   bufTable[slot].bDirty   = FALSE;
   bufTable[slot].pinCount = 1;

   // Return ok
   return (0);
}